

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool __thiscall
boost::ext::ut::v1_1_8::
runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16>::
on<baryonyx::raw_problem>
          (runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,_16> *this,
          assertion<baryonyx::raw_problem> *assertion)

{
  anon_struct_16_2_3fa459c6_for_asserts_ *paVar1;
  assertion_fail<baryonyx::raw_problem> *assertion_00;
  bool bVar2;
  assertion_fail<baryonyx::raw_problem> local_1d0;
  assertion_fail<baryonyx::raw_problem> local_f8;
  
  bVar2 = true;
  if (this->dry_run_ == false) {
    bVar2 = (assertion->expr).status == success;
    if (bVar2) {
      assertion_00 = &local_f8;
      baryonyx::raw_problem::raw_problem(&assertion_00->expr,&assertion->expr);
      local_f8.location.line_ = (assertion->location).line_;
      local_f8.location.file_ = (assertion->location).file_;
      paVar1 = &(this->reporter_).asserts_;
      paVar1->pass = paVar1->pass + 1;
    }
    else {
      this->fails_ = this->fails_ + 1;
      assertion_00 = &local_1d0;
      baryonyx::raw_problem::raw_problem(&assertion_00->expr,&assertion->expr);
      local_1d0.location.line_ = (assertion->location).line_;
      local_1d0.location.file_ = (assertion->location).file_;
      reporter<boost::ext::ut::v1_1_8::printer>::on<baryonyx::raw_problem>
                (&this->reporter_,assertion_00);
    }
    baryonyx::raw_problem::~raw_problem(&assertion_00->expr);
  }
  return bVar2;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }